

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeEmbeddingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  undefined8 uVar1;
  string *psVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar3;
  EmbeddingLayerParams *from;
  uint64 val;
  undefined1 local_60 [8];
  EmbeddingLayerParams embedding;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  embedding._48_8_ = this_01;
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_01,psVar2);
  uVar1 = embedding._48_8_;
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)uVar1,pSVar3);
  uVar1 = embedding._48_8_;
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)uVar1,pSVar3);
  pSVar3 = ShapeConstraint::sequenceRange((ShapeConstraint *)embedding._48_8_);
  ShapeConstraint::updateSequenceRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::batchRange((ShapeConstraint *)embedding._48_8_);
  ShapeConstraint::updateBatchRange(this_00,pSVar3);
  from = Specification::NeuralNetworkLayer::embedding(specLayer);
  Specification::EmbeddingLayerParams::EmbeddingLayerParams((EmbeddingLayerParams *)local_60,from);
  ShapeConstraint::setChannel(this_00,1);
  ShapeConstraint::setHeight(this_00,1);
  ShapeConstraint::setWidth(this_00,1);
  uVar1 = embedding._48_8_;
  val = Specification::EmbeddingLayerParams::outputchannels((EmbeddingLayerParams *)local_60);
  ShapeConstraint::setChannel((ShapeConstraint *)uVar1,val);
  ShapeConstraint::setHeight((ShapeConstraint *)embedding._48_8_,1);
  ShapeConstraint::setWidth((ShapeConstraint *)embedding._48_8_,1);
  Specification::EmbeddingLayerParams::~EmbeddingLayerParams((EmbeddingLayerParams *)local_60);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeEmbeddingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    // Check if this already exists? Can't -- outputs are only generated by one layer
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Embedding layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Embedding layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::EmbeddingLayerParams embedding = specLayer.embedding();

    // all three inputs need to be one
    inputShape.setChannel(1);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel((size_t)embedding.outputchannels());
    outputShape.setHeight(1);
    outputShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Embedding layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Embedding layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}